

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complexwidgets.cpp
# Opt level: O0

void __thiscall QAccessibleTabBar::~QAccessibleTabBar(QAccessibleTabBar *this)

{
  long lVar1;
  bool bVar2;
  uint *puVar3;
  const_iterator *in_RDI;
  long in_FS_OFFSET;
  Id id;
  add_const_t<QHash<int,_unsigned_int>_> *__range1;
  const_iterator __end1;
  const_iterator __begin1;
  undefined4 in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffc4;
  size_t *this_00;
  const_iterator *this_01;
  QHash<int,_unsigned_int> *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->i).d = (Data<QHashPrivate::Node<int,_unsigned_int>_> *)&PTR__QAccessibleTabBar_00d27450;
  in_RDI[1].i.d = (Data<QHashPrivate::Node<int,_unsigned_int>_> *)&PTR__QAccessibleTabBar_00d27560;
  in_RDI[2].i.d = (Data<QHashPrivate::Node<int,_unsigned_int>_> *)&PTR__QAccessibleTabBar_00d275a8;
  this_00 = &in_RDI[2].i.bucket;
  this_01 = in_RDI;
  QHash<int,_unsigned_int>::begin(in_stack_ffffffffffffffd8);
  QHash<int,_unsigned_int>::end((QHash<int,_unsigned_int> *)this_00);
  while( true ) {
    bVar2 = QHash<int,_unsigned_int>::const_iterator::operator!=
                      ((const_iterator *)this_00,
                       (const_iterator *)
                       CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    if (!bVar2) break;
    puVar3 = QHash<int,_unsigned_int>::const_iterator::operator*((const_iterator *)0x7d4265);
    in_stack_ffffffffffffffc4 = *puVar3;
    QAccessible::deleteAccessibleInterface(in_stack_ffffffffffffffc4);
    QHash<int,_unsigned_int>::const_iterator::operator++(this_01);
  }
  QHash<int,_unsigned_int>::~QHash
            ((QHash<int,_unsigned_int> *)
             CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  QAccessibleSelectionInterface::~QAccessibleSelectionInterface
            ((QAccessibleSelectionInterface *)(in_RDI + 2));
  QAccessibleWidget::~QAccessibleWidget
            ((QAccessibleWidget *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QAccessibleTabBar::~QAccessibleTabBar()
{
    for (QAccessible::Id id : std::as_const(m_childInterfaces))
        QAccessible::deleteAccessibleInterface(id);
}